

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.cpp
# Opt level: O0

void __thiscall cppcms::plugin::scope::scope(scope *this,int argc,char **argv)

{
  _data *v_00;
  _data *in_RDI;
  value v;
  char **in_stack_00000a60;
  int in_stack_00000a6c;
  _data *this_00;
  EVP_PKEY_CTX local_20 [32];
  
  this_00 = in_RDI;
  v_00 = (_data *)operator_new(0x68);
  (v_00->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  (v_00->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  *(undefined8 *)&(v_00->objects)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (v_00->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  *(undefined8 *)((long)&(v_00->pattern).field_2 + 8) = 0;
  *(undefined8 *)&(v_00->objects)._M_t._M_impl = 0;
  (v_00->pattern)._M_string_length = 0;
  (v_00->pattern).field_2._M_allocated_capacity = 0;
  (v_00->paths).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)&v_00->pattern = 0;
  (v_00->paths).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (v_00->paths).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (v_00->objects)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  _data::_data(this_00);
  booster::hold_ptr<cppcms::plugin::scope::_data>::hold_ptr
            ((hold_ptr<cppcms::plugin::scope::_data> *)this_00,v_00);
  service::load_settings(in_stack_00000a6c,in_stack_00000a60);
  init((scope *)in_RDI,local_20);
  json::value::~value((value *)0x4726a7);
  return;
}

Assistant:

scope::scope(int argc,char **argv) : d(new scope::_data())
{
	json::value v = service::load_settings(argc,argv);
	init(v);
}